

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::View<int,false,std::allocator<unsigned_long>>::view<unsigned_long*,unsigned_long*>
          (View<int,false,std::allocator<unsigned_long>> *this,unsigned_long *bit,unsigned_long *sit
          ,CoordinateOrder *internalCoordinateOrder,
          View<int,_false,_std::allocator<unsigned_long>_> *out)

{
  long lVar1;
  long lVar2;
  size_t this_00;
  View<int,_false,_std::allocator<unsigned_long>_> *internalCoordinateOrder_00;
  CoordinateOrder *begin;
  size_t sVar3;
  size_t *it;
  allocator<int> local_39;
  size_t local_38;
  size_t offset;
  View<int,_false,_std::allocator<unsigned_long>_> *out_local;
  CoordinateOrder *internalCoordinateOrder_local;
  unsigned_long *sit_local;
  unsigned_long *bit_local;
  View<int,_false,_std::allocator<unsigned_long>_> *this_local;
  
  offset = (size_t)out;
  out_local = (View<int,_false,_std::allocator<unsigned_long>_> *)internalCoordinateOrder;
  internalCoordinateOrder_local = (CoordinateOrder *)sit;
  sit_local = bit;
  bit_local = (unsigned_long *)this;
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
  local_38 = 0;
  coordinatesToOffset<unsigned_long*>(this,sit_local,&local_38);
  begin = internalCoordinateOrder_local;
  this_00 = offset;
  sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
  it = marray_detail::Geometry<std::allocator<unsigned_long>_>::stridesBegin
                 ((Geometry<std::allocator<unsigned_long>_> *)(this + 8));
  internalCoordinateOrder_00 = out_local;
  lVar2 = *(long *)this;
  lVar1 = local_38 * 4;
  std::allocator<int>::allocator(&local_39);
  assign<unsigned_long*,unsigned_long_const*>
            ((View<int,false,std::allocator<unsigned_long>> *)this_00,(unsigned_long *)begin,
             (unsigned_long *)(begin + sVar3 * 2),it,(pointer)(lVar2 + lVar1),
             (CoordinateOrder *)internalCoordinateOrder_00,&local_39);
  std::allocator<int>::~allocator(&local_39);
  return;
}

Assistant:

inline void
View<T, isConst, A>::view
(
    BaseIterator bit,
    ShapeIterator sit,
    const CoordinateOrder& internalCoordinateOrder,
    View<T, isConst, A>& out
) const
{
    testInvariant();
    std::size_t offset = 0;
    coordinatesToOffset(bit, offset);
    out.assign(sit, sit+dimension(), geometry_.stridesBegin(),
        data_+offset, internalCoordinateOrder);
}